

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O2

void __thiscall helics::CoreApp::CoreApp(CoreApp *this,int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  
  local_28 = local_18;
  local_20 = 0;
  local_18[0] = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_28;
  CoreApp(this,DEFAULT,(string_view)(auVar1 << 0x40),argc,argv);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

CoreApp::CoreApp(int argc, char* argv[]): CoreApp(CoreType::DEFAULT, std::string{}, argc, argv) {}